

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O0

void to_js_print_externs(FILE *out,Program *program,Command_Arguments *command_arguments)

{
  Command_Arguments *command_arguments_local;
  Program *program_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"\n/*EXTERNS START*/\n");
  Map_Map_Extended(&program->external_linkage->ids,_to_js_print_externs,command_arguments);
  fprintf((FILE *)out,"\n/*EXTERNS END*/\n");
  return;
}

Assistant:

void _to_js_print_externs(void *denoted,void *args)
{
#define ARGS(x) ((struct Command_Arguments*)x)
#define DENOTED(x) ((struct Denoted*)x)
#define DFUNC(x) ((struct Denoted_Function*)x)
#define DOBJ(x) ((struct Denoted_Object*)x)
	if(DENOTED(denoted)->denotation==DT_Function)
	{
		if(DFUNC(denoted)->body==NULL)
		{
			fprintf(ARGS(args)->output_file,"/*UNDEFINED*/");
		}
		fprintf(ARGS(args)->output_file,"var ");
		print_token(ARGS(args)->output_file,DFUNC(denoted)->id);
		fprintf(ARGS(args)->output_file,";");
		fprintf(ARGS(args)->output_file,"\n");

	}else if(DENOTED(denoted)->denotation==DT_Object)
	{
		fprintf(ARGS(args)->output_file,"var ");
		print_token(ARGS(args)->output_file,DFUNC(denoted)->id);
		fprintf(ARGS(args)->output_file,";\n");
	}

#undef DOBJ
#undef DFUNC
#undef ARGS
#undef DENOTED
}